

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextIO.cpp
# Opt level: O2

char * GetLogString(LogMsgTy *l)

{
  size_t sVar1;
  string netwT;
  
  std::recursive_mutex::lock(&gLogMutex);
  NetwTimeString_abi_cxx11_(&netwT,l->netwTime);
  if ((int)l->lvl < 5) {
    snprintf(gBuf,0xfcf,"%s LiveTraffic %s %s:%d/%s: %s",netwT._M_dataplus._M_p,LOG_LEVEL[l->lvl],
             (l->fileName)._M_dataplus._M_p,(ulong)(uint)l->ln,(l->func)._M_dataplus._M_p,
             (l->msg)._M_dataplus._M_p);
  }
  else {
    snprintf(gBuf,0xfcf,"%s LiveTraffic: %s",netwT._M_dataplus._M_p,(l->msg)._M_dataplus._M_p);
  }
  sVar1 = strlen(gBuf);
  if (*(char *)((long)&gLogCnt + sVar1 + 7) != '\n') {
    (gBuf + sVar1)[0] = '\n';
    (gBuf + sVar1)[1] = '\0';
  }
  std::__cxx11::string::~string((string *)&netwT);
  pthread_mutex_unlock((pthread_mutex_t *)&gLogMutex);
  return gBuf;
}

Assistant:

const char* GetLogString (const LogMsgTy& l)
{
    // Access to static buffer and list guarded by a lock
    std::lock_guard<std::recursive_mutex> lock(gLogMutex);
    
    // Network time string
    const std::string netwT = NetwTimeString(l.netwTime);

    // prepare timestamp
    if (l.lvl < logMSG)                             // normal messages without, all other with location info
    {
        snprintf(gBuf, sizeof(gBuf)-1, "%s " LIVE_TRAFFIC " %s %s:%d/%s: %s",
                 netwT.c_str(),                     // network time (string)
                 LOG_LEVEL[l.lvl],                  // logging level
                 l.fileName.c_str(), l.ln,          // source file and line number
                 l.func.c_str(),                    // function name
                 l.msg.c_str());                    // actual message
    }
    else
        snprintf(gBuf, sizeof(gBuf)-1, "%s " LIVE_TRAFFIC ": %s",
                 netwT.c_str(),                     // network time (string)
                 l.msg.c_str());                    // actual message
    
    // ensure there's a trailing CR
    size_t sl = strlen(gBuf);
    if (gBuf[sl-1] != '\n')
    {
        gBuf[sl]   = '\n';
        gBuf[sl+1] = 0;
    }

    // return the static buffer
    return gBuf;
}